

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall
HoldingProperty_SetFromProperty_Test::~HoldingProperty_SetFromProperty_Test
          (HoldingProperty_SetFromProperty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, SetFromProperty)
{
  BasicHoldingProperties obj;

  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( "", obj.ro_string_value() );
  EXPECT_EQ( "", obj.string_value_b() );

  obj.setStringValue( "bill" );
  obj.setROStringValue( "bob" );
  obj.string_value_b = obj.string_value;
  obj.string_holder = obj.string_value;
  EXPECT_EQ( "bill", obj.string_value_b() );
  EXPECT_EQ( "bill", obj.string_value() );
  EXPECT_EQ( "bill", obj.string_holder().string );
  
  obj.string_value_b = obj.ro_string_value;
  obj.string_holder = obj.ro_string_value;
  EXPECT_EQ( "bob", obj.string_value_b() );
  EXPECT_EQ( "bob", obj.ro_string_value() );
  EXPECT_EQ( "bob", obj.string_holder().string );
  
  obj.setIntValue( 75 );
  obj.long_value = obj.int_value;
  EXPECT_EQ( 75, obj.int_value() );
  EXPECT_EQ( 75, obj.long_value() );
  
  obj.setROIntValue( 34 );
  obj.long_value = obj.ro_int_value;
  EXPECT_EQ( 34, obj.ro_int_value() );
  EXPECT_EQ( 34, obj.long_value() );
  
  BasicHoldingProperties obj2;
  obj2.setStringValue( "john" );
  obj2.setROStringValue( "kate" );
  obj2.setIntValue( 35 );
  obj2.setROIntValue( 84 );
  
  obj.string_value_b = obj2.string_value;
  obj.string_holder = obj2.string_value;
  obj.long_value = obj2.int_value;
  EXPECT_EQ( "john", obj.string_value_b() );
  EXPECT_EQ( "john", obj.string_holder().string );
  EXPECT_EQ( 35, obj.long_value() );
  
  obj.string_value_b = obj2.ro_string_value;
  obj.string_holder = obj2.ro_string_value;
  obj.long_value = obj2.ro_int_value;
  EXPECT_EQ( "kate", obj.string_value_b() );
  EXPECT_EQ( "kate", obj.string_holder().string );
  EXPECT_EQ( 84, obj.long_value() );
}